

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O2

string * __thiscall
vkt::tessellation::
elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
          (string *__return_storage_ptr__,tessellation *this,
          __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *begin,
          __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *end,
          int wrapLengthParam,int numIndentationSpaces)

{
  long lVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  int length;
  allocator<char> local_10a;
  allocator<char> local_109;
  string *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  tessellation *local_e0;
  string local_d8;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string baseIndentation;
  string deepIndentation;
  
  baseIndentation._M_dataplus._M_p = (pointer)&baseIndentation.field_2;
  local_e0 = this;
  local_b8 = begin;
  std::__cxx11::string::_M_construct((ulong)&baseIndentation,(char)wrapLengthParam);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_100,'\x04');
  std::operator+(&deepIndentation,&baseIndentation,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  iVar2 = 0x7fffffff;
  if (0 < (int)end) {
    iVar2 = (int)end;
  }
  pfVar4 = local_b8->_M_current;
  lVar1 = *(long *)local_e0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  length = (int)((ulong)((long)pfVar4 - lVar1) >> 2);
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_108 = __return_storage_ptr__;
  if (iVar2 < length) {
    de::toString<int>(&local_d8,&length);
    std::operator+(&local_b0,"(amount: ",&local_d8);
    std::operator+(&local_100,&local_b0,") ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_b0,&local_d8,"{");
  if (iVar2 < length) {
    std::operator+(&local_90,"\n",&deepIndentation);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90," ",&local_109);
  }
  std::operator+(&local_100,&local_b0,&local_90);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar3 = 0;
  for (pfVar4 = *(float **)local_e0; pfVar4 != local_b8->_M_current; pfVar4 = pfVar4 + 1) {
    if (pfVar4 != *(float **)local_e0) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_b0,&local_d8,", ");
      if (iVar3 % iVar2 == 0) {
        std::operator+(&local_90,"\n",&deepIndentation);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_10a);
      }
      std::operator+(&local_100,&local_b0,&local_90);
      std::__cxx11::string::append((string *)local_108);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d8);
      __return_storage_ptr__ = local_108;
    }
    de::toString<float>(&local_100,pfVar4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    iVar3 = iVar3 + 1;
  }
  if (iVar2 < length) {
    std::operator+(&local_100,"\n",&baseIndentation);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100," ",(allocator<char> *)&local_b0);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&deepIndentation);
  std::__cxx11::string::~string((string *)&baseIndentation);
  return __return_storage_ptr__;
}

Assistant:

std::string elemsStr (const IterT& begin, const IterT& end, int wrapLengthParam = 0, int numIndentationSpaces = 0)
{
	const int			bigInt			= ~0u/2;
	const std::string	baseIndentation	= std::string(numIndentationSpaces, ' ');
	const std::string	deepIndentation	= baseIndentation + std::string(4, ' ');
	const int			wrapLength		= wrapLengthParam > 0 ? wrapLengthParam : bigInt;
	const int			length			= static_cast<int>(std::distance(begin, end));
	std::string			result;

	if (length > wrapLength)
		result += "(amount: " + de::toString(length) + ") ";
	result += std::string() + "{" + (length > wrapLength ? "\n"+deepIndentation : " ");

	{
		int index = 0;
		for (IterT it = begin; it != end; ++it)
		{
			if (it != begin)
				result += std::string() + ", " + (index % wrapLength == 0 ? "\n"+deepIndentation : "");
			result += de::toString(*it);
			index++;
		}

		result += length > wrapLength ? "\n"+baseIndentation : " ";
	}

	result += "}";
	return result;
}